

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O3

void __thiscall
TPZTensor<double>::ComputeEigenvector0
          (TPZTensor<double> *this,double *eigenvalue,TPZManVector<double,_3> *eigenvector)

{
  double *pdVar1;
  double *pdVar2;
  char cVar3;
  ulong uVar4;
  double **ppdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  TPZManVector<double,_3> r0xr2;
  TPZManVector<double,_3> r0xr1;
  TPZManVector<double,_3> r1xr2;
  TPZManVector<double,_3> row2;
  TPZManVector<double,_3> row1;
  TPZManVector<double,_3> row0;
  TPZManVector<double,_3> local_170;
  TPZManVector<double,_3> local_138;
  TPZManVector<double,_3> local_100;
  TPZManVector<double,_3> local_c8;
  TPZManVector<double,_3> local_90;
  TPZManVector<double,_3> local_58;
  
  TPZManVector<double,_3>::TPZManVector(&local_58,3);
  pdVar1 = (this->fData).super_TPZVec<double>.fStore;
  *local_58.super_TPZVec<double>.fStore = *pdVar1 - *eigenvalue;
  local_58.super_TPZVec<double>.fStore[1] = pdVar1[1];
  local_58.super_TPZVec<double>.fStore[2] = pdVar1[2];
  TPZManVector<double,_3>::TPZManVector(&local_90,3);
  pdVar1 = (this->fData).super_TPZVec<double>.fStore;
  *local_90.super_TPZVec<double>.fStore = pdVar1[1];
  local_90.super_TPZVec<double>.fStore[1] = pdVar1[3] - *eigenvalue;
  local_90.super_TPZVec<double>.fStore[2] = pdVar1[4];
  TPZManVector<double,_3>::TPZManVector(&local_c8,3);
  pdVar1 = (this->fData).super_TPZVec<double>.fStore;
  *local_c8.super_TPZVec<double>.fStore = pdVar1[2];
  local_c8.super_TPZVec<double>.fStore[1] = pdVar1[4];
  local_c8.super_TPZVec<double>.fStore[2] = pdVar1[5] - *eigenvalue;
  TPZManVector<double,_3>::TPZManVector(&local_138,3);
  Cross<double>(&local_58.super_TPZVec<double>,&local_90.super_TPZVec<double>,
                &local_138.super_TPZVec<double>);
  TPZManVector<double,_3>::TPZManVector(&local_170,3);
  Cross<double>(&local_58.super_TPZVec<double>,&local_c8.super_TPZVec<double>,
                &local_170.super_TPZVec<double>);
  TPZManVector<double,_3>::TPZManVector(&local_100,3);
  Cross<double>(&local_90.super_TPZVec<double>,&local_c8.super_TPZVec<double>,
                &local_100.super_TPZVec<double>);
  dVar7 = 0.0;
  dVar6 = 0.0;
  if (0 < (int)(uint)local_138.super_TPZVec<double>.fNElements) {
    uVar4 = 0;
    do {
      dVar6 = dVar6 + local_138.super_TPZVec<double>.fStore[uVar4] *
                      local_138.super_TPZVec<double>.fStore[uVar4];
      uVar4 = uVar4 + 1;
    } while (((uint)local_138.super_TPZVec<double>.fNElements & 0x7fffffff) != uVar4);
  }
  if (0 < (int)(uint)local_170.super_TPZVec<double>.fNElements) {
    dVar7 = 0.0;
    uVar4 = 0;
    do {
      dVar7 = dVar7 + local_170.super_TPZVec<double>.fStore[uVar4] *
                      local_170.super_TPZVec<double>.fStore[uVar4];
      uVar4 = uVar4 + 1;
    } while (((uint)local_170.super_TPZVec<double>.fNElements & 0x7fffffff) != uVar4);
  }
  if ((int)(uint)local_100.super_TPZVec<double>.fNElements < 1) {
    dVar8 = 0.0;
  }
  else {
    dVar8 = 0.0;
    uVar4 = 0;
    do {
      dVar8 = dVar8 + local_100.super_TPZVec<double>.fStore[uVar4] *
                      local_100.super_TPZVec<double>.fStore[uVar4];
      uVar4 = uVar4 + 1;
    } while (((uint)local_100.super_TPZVec<double>.fNElements & 0x7fffffff) != uVar4);
  }
  dVar9 = dVar7;
  if (dVar7 <= dVar6) {
    dVar9 = dVar6;
  }
  cVar3 = '\x02';
  if (dVar8 <= dVar9) {
    cVar3 = dVar6 < dVar7;
  }
  if (cVar3 == '\0') {
    ppdVar5 = &local_138.super_TPZVec<double>.fStore;
  }
  else if (cVar3 == '\x01') {
    ppdVar5 = &local_170.super_TPZVec<double>.fStore;
    dVar6 = dVar7;
  }
  else {
    ppdVar5 = &local_100.super_TPZVec<double>.fStore;
    dVar6 = dVar8;
  }
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar6 = 1.0 / dVar6;
  pdVar1 = *ppdVar5;
  pdVar2 = (eigenvector->super_TPZVec<double>).fStore;
  *pdVar2 = *pdVar1 * dVar6;
  pdVar2[1] = pdVar1[1] * dVar6;
  pdVar2[2] = dVar6 * pdVar1[2];
  TPZManVector<double,_3>::~TPZManVector(&local_100);
  TPZManVector<double,_3>::~TPZManVector(&local_170);
  TPZManVector<double,_3>::~TPZManVector(&local_138);
  TPZManVector<double,_3>::~TPZManVector(&local_c8);
  TPZManVector<double,_3>::~TPZManVector(&local_90);
  TPZManVector<double,_3>::~TPZManVector(&local_58);
  return;
}

Assistant:

void TPZTensor<T>::ComputeEigenvector0(const T &eigenvalue, TPZManVector<T, 3> &eigenvector) const {
    // Compute a unit-length eigenvector for eigenvalue[i0].  The matrix is
    // rank 2, so two of the rows are linearly independent.  For a robust
    // computation of the eigenvector, select the two rows whose cross product
    // has largest length of all pairs of rows.
    TPZManVector<T, 3> row0(3);
    row0[0] = XX() - eigenvalue;
    row0[1] = XY();
    row0[2] = XZ();
    TPZManVector<T, 3> row1(3);
    row1[0] = XY();
    row1[1] = YY() - eigenvalue;
    row1[2] = YZ();
    TPZManVector<T, 3> row2(3);
    row2[0] = XZ();
    row2[1] = YZ();
    row2[2] = ZZ() - eigenvalue;
    TPZManVector<T, 3> r0xr1(3);
    Cross(row0, row1, r0xr1);
    TPZManVector<T, 3> r0xr2(3);
    Cross(row0, row2, r0xr2);
    TPZManVector<T, 3> r1xr2(3);
    Cross(row1, row2, r1xr2);
    T d0 = Dot(r0xr1, r0xr1);
    T d1 = Dot(r0xr2, r0xr2);
    T d2 = Dot(r1xr2, r1xr2);

    REAL dmax = TPZExtractVal::val(d0);
    int imax = 0;
    if (TPZExtractVal::val(d1) > dmax) {
        dmax = TPZExtractVal::val(d1);
        imax = 1;
    }
    if (TPZExtractVal::val(d2) > dmax) {
        imax = 2;
    }

    if (imax == 0) {
        T inv_sqrt_val = 1. / sqrt(d0);
        eigenvector[0] = r0xr1[0] * inv_sqrt_val;
        eigenvector[1] = r0xr1[1] * inv_sqrt_val;
        eigenvector[2] = r0xr1[2] * inv_sqrt_val;
    } else if (imax == 1) {
        T inv_sqrt_val = 1. / sqrt(d1);
        eigenvector[0] = r0xr2[0] * inv_sqrt_val;
        eigenvector[1] = r0xr2[1] * inv_sqrt_val;
        eigenvector[2] = r0xr2[2] * inv_sqrt_val;
    } else {
        T inv_sqrt_val = 1. / sqrt(d2);
        eigenvector[0] = r1xr2[0] * inv_sqrt_val;
        eigenvector[1] = r1xr2[1] * inv_sqrt_val;
        eigenvector[2] = r1xr2[2] * inv_sqrt_val;
    }
}